

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void applyAffinity(Mem *pRec,char affinity,u8 enc)

{
  undefined1 in_DL;
  char in_SIL;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined6 in_stack_fffffffffffffff0;
  
  if (in_SIL < 'C') {
    if (in_SIL == 'B') {
      if (((*(ushort *)(in_RDI + 0x14) & 2) == 0) && ((*(ushort *)(in_RDI + 0x14) & 0x2c) != 0)) {
        sqlite3VdbeMemStringify
                  ((Mem *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),'\0','\0');
      }
      *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) & 0xffd3;
    }
  }
  else if ((*(ushort *)(in_RDI + 0x14) & 4) == 0) {
    if ((*(ushort *)(in_RDI + 0x14) & 0x28) == 0) {
      if ((*(ushort *)(in_RDI + 0x14) & 2) != 0) {
        applyNumericAffinity
                  ((Mem *)CONCAT17(in_SIL,CONCAT16(in_DL,in_stack_fffffffffffffff0)),
                   in_stack_ffffffffffffffec);
      }
    }
    else if (in_SIL < 'F') {
      sqlite3VdbeIntegerAffinity((Mem *)CONCAT17(in_SIL,CONCAT16(in_DL,in_stack_fffffffffffffff0)));
    }
  }
  return;
}

Assistant:

static void applyAffinity(
  Mem *pRec,          /* The value to apply affinity to */
  char affinity,      /* The affinity to be applied */
  u8 enc              /* Use this text encoding */
){
  if( affinity>=SQLITE_AFF_NUMERIC ){
    assert( affinity==SQLITE_AFF_INTEGER || affinity==SQLITE_AFF_REAL
             || affinity==SQLITE_AFF_NUMERIC || affinity==SQLITE_AFF_FLEXNUM );
    if( (pRec->flags & MEM_Int)==0 ){ /*OPTIMIZATION-IF-FALSE*/
      if( (pRec->flags & (MEM_Real|MEM_IntReal))==0 ){
        if( pRec->flags & MEM_Str ) applyNumericAffinity(pRec,1);
      }else if( affinity<=SQLITE_AFF_REAL ){
        sqlite3VdbeIntegerAffinity(pRec);
      }
    }
  }else if( affinity==SQLITE_AFF_TEXT ){
    /* Only attempt the conversion to TEXT if there is an integer or real
    ** representation (blob and NULL do not get converted) but no string
    ** representation.  It would be harmless to repeat the conversion if
    ** there is already a string rep, but it is pointless to waste those
    ** CPU cycles. */
    if( 0==(pRec->flags&MEM_Str) ){ /*OPTIMIZATION-IF-FALSE*/
      if( (pRec->flags&(MEM_Real|MEM_Int|MEM_IntReal)) ){
        testcase( pRec->flags & MEM_Int );
        testcase( pRec->flags & MEM_Real );
        testcase( pRec->flags & MEM_IntReal );
        sqlite3VdbeMemStringify(pRec, enc, 1);
      }
    }
    pRec->flags &= ~(MEM_Real|MEM_Int|MEM_IntReal);
  }
}